

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O2

bool __thiscall
bssl::ConsumeExtension
          (bssl *this,Input oid,
          map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          *unconsumed_extensions,ParsedExtension *extension)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  _Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,bssl::ParsedExtension>,std::_Select1st<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
  *this_00;
  key_type local_30;
  
  this_00 = (_Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,bssl::ParsedExtension>,std::_Select1st<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
             *)oid.data_.size_;
  local_30.data_.size_ = (size_t)oid.data_.data_;
  local_30.data_.data_ = (uchar *)this;
  __position = ::std::
               _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
               ::find((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                       *)this_00,&local_30);
  if (__position._M_node != (_Base_ptr)(this_00 + 8)) {
    *(undefined1 *)&(unconsumed_extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         *(undefined1 *)&__position._M_node[2]._M_left;
    p_Var1 = __position._M_node[1]._M_left;
    p_Var2 = __position._M_node[1]._M_right;
    p_Var3 = __position._M_node[2]._M_parent;
    (unconsumed_extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)(__position._M_node + 2);
    (unconsumed_extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
    *(_Base_ptr *)&(unconsumed_extensions->_M_t)._M_impl = p_Var1;
    *(_Base_ptr *)&(unconsumed_extensions->_M_t)._M_impl.super__Rb_tree_header._M_header = p_Var2;
    ::std::
    _Rb_tree<bssl::der::Input,std::pair<bssl::der::Input_const,bssl::ParsedExtension>,std::_Select1st<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::ParsedExtension>>>
    ::erase_abi_cxx11_(this_00,__position);
  }
  return __position._M_node != (_Base_ptr)(this_00 + 8);
}

Assistant:

OPENSSL_EXPORT bool ConsumeExtension(
    der::Input oid,
    std::map<der::Input, ParsedExtension> *unconsumed_extensions,
    ParsedExtension *extension) {
  auto it = unconsumed_extensions->find(oid);
  if (it == unconsumed_extensions->end()) {
    return false;
  }

  *extension = it->second;
  unconsumed_extensions->erase(it);
  return true;
}